

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

TimecodeComponent * __thiscall
ASDCP::MXF::TimecodeComponent::InitFromTLVSet(TimecodeComponent *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *pMVar3;
  MDDEntry *in_RDX;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  TimecodeComponent *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x4ca,
                  "virtual ASDCP::Result_t ASDCP::MXF::TimecodeComponent::InitFromTLVSet(TLVReader &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  StructuralComponent::InitFromTLVSet(&this->super_StructuralComponent,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_TimecodeComponent_RoundedTimecodeBase);
    TLVReader::ReadUi16(&local_a0,pMVar3,(ui16_t *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_TimecodeComponent_StartTimecode);
    TLVReader::ReadUi64(&local_108,pMVar3,(ui64_t *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_TimecodeComponent_DropFrame);
    TLVReader::ReadUi8(&local_170,local_20,pMVar3->ul);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  return this;
}

Assistant:

ASDCP::Result_t
TimecodeComponent::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = StructuralComponent::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi16(OBJ_READ_ARGS(TimecodeComponent, RoundedTimecodeBase));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(TimecodeComponent, StartTimecode));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(TimecodeComponent, DropFrame));
  return result;
}